

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O3

char16 * JsrtDebugUtils::GetDebugPropertyName(JsrtDebugPropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  char16 *pcVar3;
  undefined4 *puVar4;
  
  if (propertyId._value < 0x24) {
    pcVar3 = (char16 *)(&DAT_00fd168c + *(int *)(&DAT_00fd168c + (ulong)propertyId._value * 4));
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugUtils.cpp"
                       ,0x1f8,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pcVar3 = L"";
  }
  return pcVar3;
}

Assistant:

const char16 * JsrtDebugUtils::GetDebugPropertyName(JsrtDebugPropertyId propertyId)
{
    switch (propertyId)
    {
#define DEBUGOBJECTPROPERTY(name) case JsrtDebugPropertyId::##name: return _u(###name);
#include "JsrtDebugPropertiesEnum.h"
    }

    Assert(false);
    return _u("");
}